

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::typeWarning(QPDFObjectHandle *this,char *expected_type,string *warning)

{
  undefined8 qpdf;
  bool bVar1;
  logic_error *this_00;
  element_type *this_01;
  char *__rhs;
  QPDFObjectHandle local_1d8;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator<char> local_f9;
  string local_f8;
  QPDFExc local_d8;
  undefined1 local_48 [8];
  string description;
  QPDF *context;
  string *warning_local;
  char *expected_type_local;
  QPDFObjectHandle *this_local;
  
  description.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_48);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"attempted to dereference an uninitialized QPDFObjectHandle");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_01 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       this);
  QPDFObject::getDescription(this_01,(QPDF **)((long)&description.field_2 + 8),(string *)local_48);
  qpdf = description.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"operation for ",&local_1c1);
  std::operator+(&local_1a0,&local_1c0,expected_type);
  std::operator+(&local_180,&local_1a0," attempted on object of type ");
  QPDFObjectHandle(&local_1d8,this);
  __rhs = getTypeName(&local_1d8);
  std::operator+(&local_160,&local_180,__rhs);
  std::operator+(&local_140,&local_160,": ");
  std::operator+(&local_120,&local_140,warning);
  QPDFExc::QPDFExc(&local_d8,qpdf_e_object,&local_f8,(string *)local_48,0,&local_120);
  warn((QPDF *)qpdf,&local_d8);
  QPDFExc::~QPDFExc(&local_d8);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  ~QPDFObjectHandle(&local_1d8);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void
QPDFObjectHandle::typeWarning(char const* expected_type, std::string const& warning) const
{
    QPDF* context = nullptr;
    std::string description;
    // Type checks above guarantee that the object has been dereferenced. Nevertheless, dereference
    // throws exceptions in the test suite
    if (!obj) {
        throw std::logic_error("attempted to dereference an uninitialized QPDFObjectHandle");
    }
    obj->getDescription(context, description);
    // Null context handled by warn
    warn(
        context,
        QPDFExc(
            qpdf_e_object,
            "",
            description,
            0,
            std::string("operation for ") + expected_type + " attempted on object of type " +
                QPDFObjectHandle(*this).getTypeName() + ": " + warning));
}